

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> uVar2;
  _Alloc_hider __p;
  _func_int **__p_00;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  CURLcode CVar6;
  string *psVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ostream *poVar11;
  CURL_conflict *data;
  curl_slist *list;
  char *pcVar12;
  pointer pbVar13;
  string *h;
  pointer pbVar14;
  bool local_639;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  cURLProgressHelper helper;
  string actualHash_1;
  cURLEasyGuard g_curl;
  string err_1;
  char *local_450;
  string dir;
  string statusVar;
  cmFileCommandVectorOfChar chunkDebug;
  string status;
  string expectedHash;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string logVar;
  ofstream fout;
  string userpwd;
  string hashMatchMSG;
  string netrc_level;
  string local_f0;
  string local_d0;
  string netrc_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string url;
  
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fout,"DOWNLOAD must be called with at least three arguments.",
               (allocator<char> *)&err_1);
    cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    return false;
  }
  std::__cxx11::string::string((string *)&url,(string *)(pbVar13 + 1));
  std::__cxx11::string::string((string *)&file,(string *)(pbVar13 + 2));
  logVar._M_dataplus._M_p = (pointer)&logVar.field_2;
  logVar._M_string_length = 0;
  statusVar._M_dataplus._M_p = (pointer)&statusVar.field_2;
  statusVar._M_string_length = 0;
  logVar.field_2._M_local_buf[0] = '\0';
  statusVar.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_TLS_VERIFY",(allocator<char> *)&err_1);
  local_639 = cmMakefile::IsOn(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_TLS_CAINFO",(allocator<char> *)&err_1);
  local_450 = cmMakefile::GetDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::~string((string *)&fout);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_NETRC",(allocator<char> *)&err_1);
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::string((string *)&netrc_level,(string *)psVar7);
  std::__cxx11::string::~string((string *)&fout);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fout,"CMAKE_NETRC_FILE",(allocator<char> *)&err_1);
  psVar7 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&fout);
  std::__cxx11::string::string((string *)&netrc_file,(string *)psVar7);
  std::__cxx11::string::~string((string *)&fout);
  expectedHash._M_dataplus._M_p = (pointer)&expectedHash.field_2;
  expectedHash._M_string_length = 0;
  hashMatchMSG._M_dataplus._M_p = (pointer)&hashMatchMSG.field_2;
  hashMatchMSG._M_string_length = 0;
  hash._M_t.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
  super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
  super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
       (__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)0x0;
  expectedHash.field_2._M_local_buf[0] = '\0';
  hashMatchMSG.field_2._M_local_buf[0] = '\0';
  userpwd._M_dataplus._M_p = (pointer)&userpwd.field_2;
  userpwd._M_string_length = 0;
  bVar5 = false;
  userpwd.field_2._M_local_buf[0] = '\0';
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  curl_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar9 = 0;
  lVar8 = 0;
  for (pbVar13 = pbVar13 + 3;
      pbVar13 !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pbVar13 = pbVar13 + 1) {
    bVar3 = std::operator==(pbVar13,"TIMEOUT");
    if (bVar3) {
      pbVar13 = pbVar13 + 1;
      if (pbVar13 ==
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fout,"DOWNLOAD missing time for TIMEOUT.",(allocator<char> *)&err_1);
        cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
        goto LAB_001f5de2;
      }
      lVar8 = atol((pbVar13->_M_dataplus)._M_p);
    }
    else {
      bVar3 = std::operator==(pbVar13,"INACTIVITY_TIMEOUT");
      if (bVar3) {
        pbVar13 = pbVar13 + 1;
        if (pbVar13 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fout,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.",
                     (allocator<char> *)&err_1);
          cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
          goto LAB_001f5de2;
        }
        lVar9 = atol((pbVar13->_M_dataplus)._M_p);
      }
      else {
        bVar3 = std::operator==(pbVar13,"LOG");
        if (bVar3) {
          pbVar13 = pbVar13 + 1;
          if (pbVar13 ==
              (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fout,"DOWNLOAD missing VAR for LOG.",(allocator<char> *)&err_1);
            cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
            goto LAB_001f5de2;
          }
          std::__cxx11::string::_M_assign((string *)&logVar);
        }
        else {
          bVar3 = std::operator==(pbVar13,"STATUS");
          if (bVar3) {
            pbVar13 = pbVar13 + 1;
            if (pbVar13 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fout,"DOWNLOAD missing VAR for STATUS.",
                         (allocator<char> *)&err_1);
              cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
              goto LAB_001f5de2;
            }
            std::__cxx11::string::_M_assign((string *)&statusVar);
          }
          else {
            bVar3 = std::operator==(pbVar13,"TLS_VERIFY");
            if (bVar3) {
              pbVar13 = pbVar13 + 1;
              if (pbVar13 ==
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&fout,"TLS_VERIFY missing bool value.",
                           (allocator<char> *)&err_1);
                cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                goto LAB_001f5de2;
              }
              local_639 = cmSystemTools::IsOn(pbVar13);
            }
            else {
              bVar3 = std::operator==(pbVar13,"TLS_CAINFO");
              if (bVar3) {
                pbVar13 = pbVar13 + 1;
                if (pbVar13 ==
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&fout,"TLS_CAFILE missing file value.",
                             (allocator<char> *)&err_1);
                  cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                  goto LAB_001f5de2;
                }
                local_450 = (pbVar13->_M_dataplus)._M_p;
              }
              else {
                bVar3 = std::operator==(pbVar13,"NETRC_FILE");
                if (bVar3) {
                  pbVar13 = pbVar13 + 1;
                  if (pbVar13 ==
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&fout,"DOWNLOAD missing file value for NETRC_FILE.",
                               (allocator<char> *)&err_1);
                    cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                    goto LAB_001f5de2;
                  }
                  std::__cxx11::string::_M_assign((string *)&netrc_file);
                }
                else {
                  bVar3 = std::operator==(pbVar13,"NETRC");
                  if (bVar3) {
                    pbVar13 = pbVar13 + 1;
                    if (pbVar13 ==
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&fout,"DOWNLOAD missing level value for NETRC.",
                                 (allocator<char> *)&err_1);
                      cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                      goto LAB_001f5de2;
                    }
                    std::__cxx11::string::_M_assign((string *)&netrc_level);
                  }
                  else {
                    bVar3 = std::operator==(pbVar13,"EXPECTED_MD5");
                    if (bVar3) {
                      pbVar13 = pbVar13 + 1;
                      if (pbVar13 ==
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&fout,"DOWNLOAD missing sum value for EXPECTED_MD5.",
                                   (allocator<char> *)&err_1);
                        cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                        goto LAB_001f5de2;
                      }
                      err_1._M_dataplus._M_p = err_1._M_dataplus._M_p & 0xffffffff00000000;
                      std::make_unique<cmCryptoHash,cmCryptoHash::Algo>((Algo *)&fout);
                      __p_00 = fout.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream;
                      fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)0x0;
                      std::__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::reset
                                ((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                  *)&hash,(pointer)__p_00);
                      std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
                                ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                                 &fout);
                      std::__cxx11::string::assign((char *)&hashMatchMSG);
                      cmsys::SystemTools::LowerCase((string *)&fout,pbVar13);
                      std::__cxx11::string::operator=((string *)&expectedHash,(string *)&fout);
LAB_001f5316:
                      std::__cxx11::string::~string((string *)&fout);
                    }
                    else {
                      bVar3 = std::operator==(pbVar13,"SHOW_PROGRESS");
                      if (bVar3) {
                        bVar5 = true;
                      }
                      else {
                        bVar3 = std::operator==(pbVar13,"EXPECTED_HASH");
                        if (bVar3) {
                          pbVar13 = pbVar13 + 1;
                          if (pbVar13 ==
                              (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&fout,
                                       "DOWNLOAD missing ALGO=value for EXPECTED_HASH.",
                                       (allocator<char> *)&err_1);
                            cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
LAB_001f5de2:
                            std::__cxx11::string::~string((string *)&fout);
                          }
                          else {
                            lVar10 = std::__cxx11::string::find((char *)pbVar13,0x43ac50);
                            if (lVar10 == -1) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&fout,
                                         "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ",
                                         (allocator<char> *)&err_1);
                              std::__cxx11::string::append((string *)&fout);
                              cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                              goto LAB_001f5de2;
                            }
                            std::__cxx11::string::substr((ulong)&fout,(ulong)pbVar13);
                            std::__cxx11::string::substr((ulong)&helper,(ulong)pbVar13);
                            cmsys::SystemTools::LowerCase(&err_1,(string *)&helper);
                            std::__cxx11::string::operator=
                                      ((string *)&expectedHash,(string *)&err_1);
                            std::__cxx11::string::~string((string *)&err_1);
                            std::__cxx11::string::~string((string *)&helper);
                            cmCryptoHash::New((cmCryptoHash *)&err_1,
                                              (char *)fout.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream);
                            __p = err_1._M_dataplus;
                            err_1._M_dataplus._M_p = (pointer)0x0;
                            std::__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                            reset((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                   *)&hash,(pointer)__p._M_p);
                            std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                            ~unique_ptr((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                         *)&err_1);
                            uVar2 = hash;
                            if ((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)
                                hash._M_t.
                                super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                                .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl ==
                                (__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)
                                0x0) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&err_1,
                                         "DOWNLOAD EXPECTED_HASH given unknown ALGO: ",
                                         (allocator<char> *)&helper);
                              std::__cxx11::string::append((string *)&err_1);
                              cmCommand::SetError(&this->super_cmCommand,&err_1);
                            }
                            else {
                              std::operator+(&err_1,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&fout," hash");
                              std::__cxx11::string::operator=
                                        ((string *)&hashMatchMSG,(string *)&err_1);
                            }
                            std::__cxx11::string::~string((string *)&err_1);
                            std::__cxx11::string::~string((string *)&fout);
                            if ((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)
                                uVar2._M_t.
                                super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                                .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl !=
                                (__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)
                                0x0) goto LAB_001f552b;
                          }
                          bVar5 = false;
                          goto LAB_001f5df1;
                        }
                        bVar3 = std::operator==(pbVar13,"USERPWD");
                        if (bVar3) {
                          pbVar13 = pbVar13 + 1;
                          if (pbVar13 ==
                              (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&fout,"DOWNLOAD missing string for USERPWD.",
                                       (allocator<char> *)&err_1);
                            cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                            goto LAB_001f5de2;
                          }
                          std::__cxx11::string::_M_assign((string *)&userpwd);
                        }
                        else {
                          bVar3 = std::operator==(pbVar13,"HTTPHEADER");
                          if (!bVar3) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&fout,"Unexpected argument: ",
                                       (allocator<char> *)&err_1);
                            std::__cxx11::string::append((string *)&fout);
                            cmMakefile::IssueMessage
                                      ((this->super_cmCommand).Makefile,AUTHOR_WARNING,
                                       (string *)&fout);
                            goto LAB_001f5316;
                          }
                          pbVar13 = pbVar13 + 1;
                          if (pbVar13 ==
                              (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&fout,"DOWNLOAD missing string for HTTPHEADER.",
                                       (allocator<char> *)&err_1);
                            cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
                            goto LAB_001f5de2;
                          }
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back(&curl_headers,pbVar13);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_001f552b:
  }
  bVar3 = cmsys::SystemTools::FileExists(&file);
  if ((bVar3) &&
     ((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)
      hash._M_t.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
      super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
      super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)0x0)) {
    err_1._M_dataplus._M_p = (pointer)&err_1.field_2;
    err_1._M_string_length = 0;
    err_1.field_2._M_local_buf[0] = '\0';
    cmCryptoHash::HashFile
              ((string *)&helper,
               (cmCryptoHash *)
               hash._M_t.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>.
               _M_t.super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
               super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl,&file);
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &helper,&expectedHash);
    if (_Var4) {
      std::__cxx11::string::assign((char *)&err_1);
      std::__cxx11::string::append((string *)&err_1);
      std::__cxx11::string::append((char *)&err_1);
      if (statusVar._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
        poVar11 = (ostream *)std::ostream::operator<<(&fout,0);
        poVar11 = std::operator<<(poVar11,";\"");
        std::operator<<(poVar11,(string *)&err_1);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::AddDefinition(pcVar1,&statusVar,dir._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&dir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
      }
      std::__cxx11::string::~string((string *)&helper);
      std::__cxx11::string::~string((string *)&err_1);
      bVar5 = true;
      goto LAB_001f5df1;
    }
    std::__cxx11::string::~string((string *)&helper);
    std::__cxx11::string::~string((string *)&err_1);
  }
  cmsys::SystemTools::GetFilenamePath(&dir,&file);
  bVar3 = cmsys::SystemTools::FileExists(&dir);
  if ((bVar3) || (bVar3 = cmsys::SystemTools::MakeDirectory(&dir,(mode_t *)0x0), bVar3)) {
    std::ofstream::ofstream(&fout,file._M_dataplus._M_p,_S_bin);
    if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5
        ) == 0) {
      curl_global_init(3);
      data = curl_easy_init();
      if (data == (CURL_conflict *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err_1,"DOWNLOAD error initializing curl.",(allocator<char> *)&helper);
        cmCommand::SetError(&this->super_cmCommand,&err_1);
        goto LAB_001f57c2;
      }
      g_curl.Easy = data;
      CVar6 = curl_easy_setopt(data,CURLOPT_URL,url._M_dataplus._M_p);
      if (CVar6 == CURLE_OK) {
        CVar6 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
        if (CVar6 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err_1,"DOWNLOAD cannot set http failure option: ",
                     (allocator<char> *)&helper);
          curl_easy_strerror(CVar6);
          std::__cxx11::string::append((char *)&err_1);
          cmCommand::SetError(&this->super_cmCommand,&err_1);
          goto LAB_001f5b54;
        }
        CVar6 = curl_easy_setopt(data,CURLOPT_USERAGENT,"curl/7.62.0");
        if (CVar6 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err_1,"DOWNLOAD cannot set user agent option: ",
                     (allocator<char> *)&helper);
          curl_easy_strerror(CVar6);
          std::__cxx11::string::append((char *)&err_1);
          cmCommand::SetError(&this->super_cmCommand,&err_1);
          goto LAB_001f5b54;
        }
        CVar6 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_571eba::cmWriteToFileCallback);
        if (CVar6 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err_1,"DOWNLOAD cannot set write function: ",
                     (allocator<char> *)&helper);
          curl_easy_strerror(CVar6);
          std::__cxx11::string::append((char *)&err_1);
          cmCommand::SetError(&this->super_cmCommand,&err_1);
          goto LAB_001f5b54;
        }
        CVar6 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_571eba::cmFileCommandCurlDebugCallback);
        if (CVar6 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err_1,"DOWNLOAD cannot set debug function: ",
                     (allocator<char> *)&helper);
          curl_easy_strerror(CVar6);
          std::__cxx11::string::append((char *)&err_1);
          cmCommand::SetError(&this->super_cmCommand,&err_1);
          goto LAB_001f5b54;
        }
        if (local_639 == false) {
          CVar6 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
          if (CVar6 == CURLE_OK) goto LAB_001f5cda;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err_1,"Unable to set TLS/SSL Verify off: ",
                     (allocator<char> *)&helper);
          curl_easy_strerror(CVar6);
          std::__cxx11::string::append((char *)&err_1);
          cmCommand::SetError(&this->super_cmCommand,&err_1);
          goto LAB_001f5b54;
        }
        CVar6 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,1);
        if (CVar6 != CURLE_OK) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&err_1,"Unable to set TLS/SSL Verify on: ",(allocator<char> *)&helper
                    );
          curl_easy_strerror(CVar6);
          std::__cxx11::string::append((char *)&err_1);
          cmCommand::SetError(&this->super_cmCommand,&err_1);
          goto LAB_001f5b54;
        }
LAB_001f5cda:
        cmCurlSetCAInfo_abi_cxx11_(&local_d0,data,local_450);
        if (local_d0._M_string_length == 0) {
          cmsys::SystemTools::UpperCase(&err_1,&netrc_level);
          std::__cxx11::string::operator=((string *)&netrc_level,(string *)&err_1);
          std::__cxx11::string::~string((string *)&err_1);
          cmCurlSetNETRCOption(&local_f0,data,&netrc_level,&netrc_file);
          if (local_f0._M_string_length == 0) {
            chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            CVar6 = curl_easy_setopt(data,CURLOPT_WRITEDATA,&fout);
            if (CVar6 == CURLE_OK) {
              CVar6 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&chunkDebug);
              if (CVar6 != CURLE_OK) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&err_1,"DOWNLOAD cannot set debug data: ",
                           (allocator<char> *)&helper);
                curl_easy_strerror(CVar6);
                std::__cxx11::string::append((char *)&err_1);
                cmCommand::SetError(&this->super_cmCommand,&err_1);
                goto LAB_001f5fa4;
              }
              CVar6 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
              if (CVar6 != CURLE_OK) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&err_1,"DOWNLOAD cannot set follow-redirect option: ",
                           (allocator<char> *)&helper);
                curl_easy_strerror(CVar6);
                std::__cxx11::string::append((char *)&err_1);
                cmCommand::SetError(&this->super_cmCommand,&err_1);
                goto LAB_001f5fa4;
              }
              if ((logVar._M_string_length != 0) &&
                 (CVar6 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar6 != CURLE_OK)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&err_1,"DOWNLOAD cannot set verbose: ",
                           (allocator<char> *)&helper);
                curl_easy_strerror(CVar6);
                std::__cxx11::string::append((char *)&err_1);
                cmCommand::SetError(&this->super_cmCommand,&err_1);
                goto LAB_001f5fa4;
              }
              if ((0 < lVar8) &&
                 (CVar6 = curl_easy_setopt(data,CURLOPT_TIMEOUT,lVar8), CVar6 != CURLE_OK)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&err_1,"DOWNLOAD cannot set timeout: ",
                           (allocator<char> *)&helper);
                curl_easy_strerror(CVar6);
                std::__cxx11::string::append((char *)&err_1);
                cmCommand::SetError(&this->super_cmCommand,&err_1);
                goto LAB_001f5fa4;
              }
              if (0 < lVar9) {
                curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
                curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,lVar9);
              }
              anon_unknown.dwarf_571eba::cURLProgressHelper::cURLProgressHelper
                        (&helper,this,"download");
              if (bVar5) {
                CVar6 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
                if (CVar6 == CURLE_OK) {
                  CVar6 = curl_easy_setopt(data,CURLOPT_PROGRESSFUNCTION,
                                           anon_unknown.dwarf_571eba::cmFileDownloadProgressCallback
                                          );
                  if (CVar6 == CURLE_OK) {
                    CVar6 = curl_easy_setopt(data,CURLOPT_PROGRESSDATA,&helper);
                    if (CVar6 == CURLE_OK) goto LAB_001f61d9;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&err_1,"DOWNLOAD cannot set progress data: ",
                               (allocator<char> *)&actualHash_1);
                    curl_easy_strerror(CVar6);
                    std::__cxx11::string::append((char *)&err_1);
                    cmCommand::SetError(&this->super_cmCommand,&err_1);
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&err_1,"DOWNLOAD cannot set progress function: ",
                               (allocator<char> *)&actualHash_1);
                    curl_easy_strerror(CVar6);
                    std::__cxx11::string::append((char *)&err_1);
                    cmCommand::SetError(&this->super_cmCommand,&err_1);
                  }
                }
                else {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&err_1,"DOWNLOAD cannot set noprogress value: ",
                             (allocator<char> *)&actualHash_1);
                  curl_easy_strerror(CVar6);
                  std::__cxx11::string::append((char *)&err_1);
                  cmCommand::SetError(&this->super_cmCommand,&err_1);
                }
LAB_001f6239:
                psVar7 = &err_1;
LAB_001f623e:
                std::__cxx11::string::~string((string *)psVar7);
                bVar5 = false;
              }
              else {
LAB_001f61d9:
                if ((userpwd._M_string_length != 0) &&
                   (CVar6 = curl_easy_setopt(data,CURLOPT_USERPWD,userpwd._M_dataplus._M_p),
                   CVar6 != CURLE_OK)) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&err_1,"DOWNLOAD cannot set user password: ",
                             (allocator<char> *)&actualHash_1);
                  curl_easy_strerror(CVar6);
                  std::__cxx11::string::append((char *)&err_1);
                  cmCommand::SetError(&this->super_cmCommand,&err_1);
                  goto LAB_001f6239;
                }
                pbVar13 = curl_headers.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                list = (curl_slist *)0x0;
                for (pbVar14 = curl_headers.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar13;
                    pbVar14 = pbVar14 + 1) {
                  list = curl_slist_append(list,(pbVar14->_M_dataplus)._M_p);
                }
                curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
                CVar6 = curl_easy_perform(data);
                curl_slist_free_all(list);
                g_curl.Easy = (CURL *)0x0;
                curl_easy_cleanup(data);
                if (statusVar._M_string_length != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&err_1);
                  poVar11 = (ostream *)std::ostream::operator<<(&err_1,CVar6);
                  poVar11 = std::operator<<(poVar11,";\"");
                  pcVar12 = curl_easy_strerror(CVar6);
                  poVar11 = std::operator<<(poVar11,pcVar12);
                  std::operator<<(poVar11,"\"");
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::__cxx11::stringbuf::str();
                  cmMakefile::AddDefinition(pcVar1,&statusVar,actualHash_1._M_dataplus._M_p);
                  std::__cxx11::string::~string((string *)&actualHash_1);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err_1);
                }
                curl_global_cleanup();
                std::ostream::flush();
                std::ofstream::close();
                if ((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)
                    hash._M_t.
                    super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
                    super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                    super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)0x0) {
                  cmCryptoHash::HashFile
                            (&actualHash_1,
                             (cmCryptoHash *)
                             hash._M_t.
                             super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                             .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl,&file);
                  if (actualHash_1._M_string_length == 0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&err_1,"DOWNLOAD cannot compute hash on downloaded file",
                               (allocator<char> *)&status);
                    cmCommand::SetError(&this->super_cmCommand,&err_1);
                    std::__cxx11::string::~string((string *)&err_1);
                  }
                  else {
                    bVar5 = std::operator!=(&expectedHash,&actualHash_1);
                    if (!bVar5) {
                      std::__cxx11::string::~string((string *)&actualHash_1);
                      goto LAB_001f65fb;
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&err_1);
                    poVar11 = std::operator<<((ostream *)&err_1,"DOWNLOAD HASH mismatch");
                    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                    poVar11 = std::operator<<(poVar11,"  for file: [");
                    poVar11 = std::operator<<(poVar11,(string *)&file);
                    poVar11 = std::operator<<(poVar11,"]");
                    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                    poVar11 = std::operator<<(poVar11,"    expected hash: [");
                    poVar11 = std::operator<<(poVar11,(string *)&expectedHash);
                    poVar11 = std::operator<<(poVar11,"]");
                    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                    poVar11 = std::operator<<(poVar11,"      actual hash: [");
                    poVar11 = std::operator<<(poVar11,(string *)&actualHash_1);
                    poVar11 = std::operator<<(poVar11,"]");
                    poVar11 = std::endl<char,std::char_traits<char>>(poVar11);
                    poVar11 = std::operator<<(poVar11,"           status: [");
                    poVar11 = (ostream *)std::ostream::operator<<(poVar11,CVar6);
                    poVar11 = std::operator<<(poVar11,";\"");
                    pcVar12 = curl_easy_strerror(CVar6);
                    poVar11 = std::operator<<(poVar11,pcVar12);
                    poVar11 = std::operator<<(poVar11,"\"]");
                    std::endl<char,std::char_traits<char>>(poVar11);
                    if (CVar6 == CURLE_OK && statusVar._M_string_length != 0) {
                      std::operator+(&local_90,"1;HASH mismatch: expected: ",&expectedHash);
                      std::operator+(&local_70,&local_90," actual: ");
                      std::operator+(&status,&local_70,&actualHash_1);
                      std::__cxx11::string::~string((string *)&local_70);
                      std::__cxx11::string::~string((string *)&local_90);
                      cmMakefile::AddDefinition
                                ((this->super_cmCommand).Makefile,&statusVar,status._M_dataplus._M_p
                                );
                      std::__cxx11::string::~string((string *)&status);
                    }
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(&this->super_cmCommand,&status);
                    std::__cxx11::string::~string((string *)&status);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&err_1);
                  }
                  psVar7 = &actualHash_1;
                  goto LAB_001f623e;
                }
LAB_001f65fb:
                bVar5 = true;
                if (logVar._M_string_length != 0) {
                  err_1._M_dataplus._M_p = err_1._M_dataplus._M_p & 0xffffffffffffff00;
                  std::vector<char,_std::allocator<char>_>::emplace_back<char>
                            (&chunkDebug,(char *)&err_1);
                  cmMakefile::AddDefinition
                            ((this->super_cmCommand).Makefile,&logVar,
                             chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
                }
              }
              std::__cxx11::string::~string((string *)&helper.Text);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err_1,"DOWNLOAD cannot set write data: ",
                         (allocator<char> *)&helper);
              curl_easy_strerror(CVar6);
              std::__cxx11::string::append((char *)&err_1);
              cmCommand::SetError(&this->super_cmCommand,&err_1);
LAB_001f5fa4:
              std::__cxx11::string::~string((string *)&err_1);
              bVar5 = false;
            }
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      (&chunkDebug.super__Vector_base<char,_std::allocator<char>_>);
          }
          else {
            cmCommand::SetError(&this->super_cmCommand,&local_f0);
            bVar5 = false;
          }
          std::__cxx11::string::~string((string *)&local_f0);
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,&local_d0);
          bVar5 = false;
        }
        std::__cxx11::string::~string((string *)&local_d0);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err_1,"DOWNLOAD cannot set url: ",(allocator<char> *)&helper);
        curl_easy_strerror(CVar6);
        std::__cxx11::string::append((char *)&err_1);
        cmCommand::SetError(&this->super_cmCommand,&err_1);
LAB_001f5b54:
        std::__cxx11::string::~string((string *)&err_1);
        bVar5 = false;
      }
      anon_unknown.dwarf_571eba::cURLEasyGuard::~cURLEasyGuard(&g_curl);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&err_1,"DOWNLOAD cannot open file for write.",(allocator<char> *)&helper)
      ;
      cmCommand::SetError(&this->super_cmCommand,&err_1);
LAB_001f57c2:
      std::__cxx11::string::~string((string *)&err_1);
      bVar5 = false;
    }
    std::ofstream::~ofstream(&fout);
  }
  else {
    std::operator+(&err_1,"DOWNLOAD error: cannot create directory \'",&dir);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,&err_1
                   ,
                   "\' - Specify file by full path name and verify that you have directory creation and file write privileges."
                  );
    std::__cxx11::string::~string((string *)&err_1);
    cmCommand::SetError(&this->super_cmCommand,(string *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&dir);
LAB_001f5df1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&curl_headers);
  std::__cxx11::string::~string((string *)&userpwd);
  std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr(&hash);
  std::__cxx11::string::~string((string *)&hashMatchMSG);
  std::__cxx11::string::~string((string *)&expectedHash);
  std::__cxx11::string::~string((string *)&netrc_file);
  std::__cxx11::string::~string((string *)&netrc_level);
  std::__cxx11::string::~string((string *)&statusVar);
  std::__cxx11::string::~string((string *)&logVar);
  std::__cxx11::string::~string((string *)&file);
  std::__cxx11::string::~string((string *)&url);
  return bVar5;
}

Assistant:

bool cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if (args.size() < 3) {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
  }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string netrc_level = this->Makefile->GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    this->Makefile->GetSafeDefinition("CMAKE_NETRC_FILE");
  std::string expectedHash;
  std::string hashMatchMSG;
  std::unique_ptr<cmCryptoHash> hash;
  bool showProgress = false;
  std::string userpwd;

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmSystemTools::IsOn(*i);
      } else {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = i->c_str();
      } else {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
      }
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        this->SetError("DOWNLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        this->SetError("DOWNLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "EXPECTED_MD5") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
      }
      hash = cm::make_unique<cmCryptoHash>(cmCryptoHash::AlgoMD5);
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "EXPECTED_HASH") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
      }
      std::string::size_type pos = i->find("=");
      if (pos == std::string::npos) {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
      }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos + 1));
      hash = std::unique_ptr<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if (!hash) {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
      }
      hashMatchMSG = algo + " hash";
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = "Unexpected argument: ";
      err += *i;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, err);
    }
    ++i;
  }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if (cmSystemTools::FileExists(file) && hash.get()) {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if (actualHash == expectedHash) {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if (!statusVar.empty()) {
        std::ostringstream result;
        result << 0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar, result.str().c_str());
      }
      return true;
    }
  }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if (!cmSystemTools::FileExists(dir) && !cmSystemTools::MakeDirectory(dir)) {
    std::string errstring = "DOWNLOAD error: cannot create directory '" + dir +
      "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
  }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if (!fout) {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
  }

#  if defined(_WIN32)
  url = fix_file_url_windows(url);
#  endif

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
  }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
  }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    this->SetError(cainfo_err);
    return false;
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    this->SetError(netrc_option_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
  }

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "DOWNLOAD cannot set user password: ");
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    std::ostringstream result;
    result << static_cast<int>(res) << ";\"" << ::curl_easy_strerror(res)
           << "\"";
    this->Makefile->AddDefinition(statusVar, result.str().c_str());
  }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash) {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty()) {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
    }

    if (expectedHash != actualHash) {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
          << "  for file: [" << file << "]" << std::endl
          << "    expected hash: [" << expectedHash << "]" << std::endl
          << "      actual hash: [" << actualHash << "]" << std::endl
          << "           status: [" << static_cast<int>(res) << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl;

      if (!statusVar.empty() && res == 0) {
        std::string status = "1;HASH mismatch: "
                             "expected: " +
          expectedHash + " actual: " + actualHash;
        this->Makefile->AddDefinition(statusVar, status.c_str());
      }

      this->SetError(oss.str());
      return false;
    }
  }

  if (!logVar.empty()) {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, chunkDebug.data());
  }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}